

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O1

void ppu_dma_write(gb_ppu_t *ppu,uint8_t value)

{
  uint8_t uVar1;
  long lVar2;
  
  if (ppu != (gb_ppu_t *)0x0) {
    if (value < 0xe0) {
      lVar2 = 0;
      do {
        uVar1 = mmu_read(&ppu->gb->mmu,(ushort)value * 0x100 + (short)lVar2);
        ppu->oam[lVar2] = uVar1;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0xa0);
    }
    return;
  }
  __assert_fail("ppu != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/ppu.c"
                ,0x20c,"void ppu_dma_write(gb_ppu_t *, uint8_t)");
}

Assistant:

void ppu_dma_write(gb_ppu_t *ppu, uint8_t value)
{
    assert(ppu != NULL);

    if (value > 0xDF)
        return;

    for (uint8_t i = 0; i < OAM_SIZE; i++)
        ppu->oam[i] = mmu_read(&ppu->gb->mmu, (value << 8) | i);
}